

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

void __thiscall Kvm::displayValue(Kvm *this,Value *v,ostream *out)

{
  size_t sVar1;
  char *pcVar2;
  char local_1b [3];
  
  if (((ulong)v & 1) != 0) {
    std::ostream::_M_insert<long>((long)out);
    return;
  }
  if (((ulong)v & 2) == 0) {
    switch(v->type_) {
    case BOOLEAN:
      pcVar2 = "#f";
      if (*(char *)&v[1]._vptr_Value != '\0') {
        pcVar2 = "#t";
      }
      sVar1 = 2;
      break;
    case STRING:
    case SYMBOL:
      pcVar2 = (char *)v[1]._vptr_Value;
      if ((_func_int **)pcVar2 == (_func_int **)0x0) {
        std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
        return;
      }
      sVar1 = strlen(pcVar2);
      break;
    default:
      pcVar2 = "`display` primitive is not implemented for this object";
      sVar1 = 0x36;
      break;
    case CELL:
      local_1b[1] = 0x28;
      std::__ostream_insert<char,std::char_traits<char>>(out,local_1b + 1,1);
      displayCell(this,v,out);
      pcVar2 = local_1b + 2;
      local_1b[2] = 0x29;
      goto LAB_0010a101;
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,sVar1);
    return;
  }
  local_1b[0] = (char)((ulong)v >> 2);
  pcVar2 = local_1b;
LAB_0010a101:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,1);
  return;
}

Assistant:

void Kvm::displayValue(const Value *v, std::ostream &out)
{
    if (IS_INT(v))
    {
        out << TK_INT(v);
    } else if (IS_CHR(v))
    {
        out << TK_CHR(v);
    } else 
    {
        switch (v->type())
        {
            case ValueType::BOOLEAN:
                out << (static_cast<const Boolean *>(v)->value_ ? "#t" : "#f");
                break;
            case ValueType::STRING:
                out << (static_cast<const String *>(v)->value_);
                break;
            case ValueType::SYMBOL:
                out << (static_cast<const String *>(v)->value_);
                break;
            case ValueType::CELL:
                out << '(';
                displayCell(v, out);
                out << ')';
                break;
            default:
                out << "`display` primitive is not implemented for this object";
                break;
        }
    }
}